

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

bool gl4cts::TextureViewUtilities::isLegalTextureTargetForTextureView
               (GLenum original_texture_target,GLenum view_texture_target)

{
  bool bVar1;
  bool bVar2;
  
  if ((int)original_texture_target < 0x8c18) {
    if ((int)original_texture_target < 0x806f) {
      if (original_texture_target == 0xde0) {
        bVar1 = view_texture_target == 0xde0;
        bVar2 = view_texture_target == 0x8c18;
      }
      else {
        if (original_texture_target != 0xde1) {
          return false;
        }
        bVar1 = view_texture_target == 0xde1;
        bVar2 = view_texture_target == 0x8c1a;
      }
LAB_00a1fcf1:
      return (bool)(bVar2 | bVar1);
    }
    if (original_texture_target == 0x806f) {
      return view_texture_target == 0x806f;
    }
    if (original_texture_target == 0x84f5) {
      return view_texture_target == 0x84f5;
    }
    if (original_texture_target != 0x8513) {
      return false;
    }
  }
  else if ((int)original_texture_target < 0x9009) {
    if (original_texture_target == 0x8c18) {
      bVar1 = view_texture_target == 0x8c18;
      bVar2 = view_texture_target == 0xde0;
      goto LAB_00a1fcf1;
    }
    if (original_texture_target != 0x8c1a) {
      return false;
    }
  }
  else if (original_texture_target != 0x9009) {
    if ((original_texture_target != 0x9100) && (original_texture_target != 0x9102)) {
      return false;
    }
    return (view_texture_target & 0xfffffffd) == 0x9100;
  }
  if ((int)view_texture_target < 0x8c1a) {
    if ((view_texture_target != 0xde1) && (view_texture_target != 0x8513)) {
      return false;
    }
  }
  else if ((view_texture_target != 0x8c1a) && (view_texture_target != 0x9009)) {
    return false;
  }
  return true;
}

Assistant:

bool TextureViewUtilities::isLegalTextureTargetForTextureView(glw::GLenum original_texture_target,
															  glw::GLenum view_texture_target)
{
	bool result = false;

	switch (original_texture_target)
	{
	case GL_TEXTURE_1D:
	{
		result = (view_texture_target == GL_TEXTURE_1D || view_texture_target == GL_TEXTURE_1D_ARRAY);

		break;
	}

	case GL_TEXTURE_2D:
	{
		result = (view_texture_target == GL_TEXTURE_2D || view_texture_target == GL_TEXTURE_2D_ARRAY);

		break;
	}

	case GL_TEXTURE_3D:
	{
		result = (view_texture_target == GL_TEXTURE_3D);

		break;
	}

	case GL_TEXTURE_CUBE_MAP:
	{
		result = (view_texture_target == GL_TEXTURE_CUBE_MAP || view_texture_target == GL_TEXTURE_2D ||
				  view_texture_target == GL_TEXTURE_2D_ARRAY || view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

		break;
	}

	case GL_TEXTURE_RECTANGLE:
	{
		result = (view_texture_target == GL_TEXTURE_RECTANGLE);

		break;
	}

	case GL_TEXTURE_BUFFER:
	{
		/* No targets supported */

		break;
	}

	case GL_TEXTURE_1D_ARRAY:
	{
		result = (view_texture_target == GL_TEXTURE_1D_ARRAY || view_texture_target == GL_TEXTURE_1D);

		break;
	}

	case GL_TEXTURE_2D_ARRAY:
	{
		result = (view_texture_target == GL_TEXTURE_2D_ARRAY || view_texture_target == GL_TEXTURE_2D ||
				  view_texture_target == GL_TEXTURE_CUBE_MAP || view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

		break;
	}

	case GL_TEXTURE_CUBE_MAP_ARRAY:
	{
		result = (view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY || view_texture_target == GL_TEXTURE_2D_ARRAY ||
				  view_texture_target == GL_TEXTURE_2D || view_texture_target == GL_TEXTURE_CUBE_MAP);

		break;
	}

	case GL_TEXTURE_2D_MULTISAMPLE:
	{
		result = (view_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
				  view_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

		break;
	}

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
	{
		result = (view_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
				  view_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

		break;
	}
	} /* switch (original_texture_target) */

	return result;
}